

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

int64_t __thiscall METADemuxer::getDemuxedSize(METADemuxer *this)

{
  bool bVar1;
  int iVar2;
  reference pSVar3;
  undefined4 extraout_var;
  int64_t iVar4;
  StreamInfo *si;
  iterator __end1;
  iterator __begin1;
  vector<StreamInfo,_std::allocator<StreamInfo>_> *__range1;
  int64_t rez;
  METADemuxer *this_local;
  
  __range1 = (vector<StreamInfo,_std::allocator<StreamInfo>_> *)0x0;
  __end1 = std::vector<StreamInfo,_std::allocator<StreamInfo>_>::begin(&this->m_codecInfo);
  si = (StreamInfo *)std::vector<StreamInfo,_std::allocator<StreamInfo>_>::end(&this->m_codecInfo);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
                                *)&si);
    if (!bVar1) break;
    pSVar3 = __gnu_cxx::
             __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>
             ::operator*(&__end1);
    iVar2 = (*(pSVar3->m_streamReader->super_BaseAbstractStreamReader).
              _vptr_BaseAbstractStreamReader[3])();
    __range1 = (vector<StreamInfo,_std::allocator<StreamInfo>_> *)
               ((long)&(__range1->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>).
                       _M_impl.super__Vector_impl_data._M_start + CONCAT44(extraout_var,iVar2));
    __gnu_cxx::
    __normal_iterator<StreamInfo_*,_std::vector<StreamInfo,_std::allocator<StreamInfo>_>_>::
    operator++(&__end1);
  }
  iVar4 = ContainerToReaderWrapper::getDiscardedSize(&this->m_containerReader);
  return (long)&(__range1->super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar4;
}

Assistant:

int64_t METADemuxer::getDemuxedSize()
{
    int64_t rez = 0;
    for (const StreamInfo& si : m_codecInfo)
        rez += si.m_streamReader->getProcessedSize();  // m_codecInfo[i].m_dataProcessed;
    return rez + m_containerReader.getDiscardedSize();
}